

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

bool __thiscall internalJSONNode::operator_cast_to_bool(internalJSONNode *this)

{
  double dVar1;
  uchar uVar2;
  undefined1 uVar3;
  internalJSONNode *this_00;
  json_string local_40;
  
  this_00 = this;
  Fetch(this);
  uVar2 = this->_type;
  if (uVar2 == '\0') {
    uVar3 = 0;
  }
  else if (uVar2 == '\x02') {
    dVar1 = (this->_value)._number;
    uVar3 = dVar1 <= -1e-05;
    if (0.0 < dVar1) {
      uVar3 = 1e-05 <= dVar1;
    }
  }
  else {
    if (jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single == '\0') {
      operator_cast_to_bool(this_00);
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single,
               DAT_00127748 + jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single);
    std::__cxx11::string::append((char *)&local_40);
    JSONDebug::_JSON_ASSERT(uVar2 == '\x03',&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    uVar3 = (this->_value)._bool;
  }
  return (bool)uVar3;
}

Assistant:

internalJSONNode::operator bool() const json_nothrow {
    Fetch();
    #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
	   switch(type()){
		  case JSON_NUMBER:
			 return !_floatsAreEqual(_value._number, (json_number)0.0);
		  case JSON_NULL:
			 return false;
	   }
    #endif /*<- */
    JSON_ASSERT(type() == JSON_BOOL, json_global(ERROR_UNDEFINED) + JSON_TEXT("(bool)"));
    return _value._bool;
}